

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pDrawCallBatchingTests.cpp
# Opt level: O3

Statistics *
deqp::gles2::Performance::anon_unknown_0::calculateStats
          (Statistics *__return_storage_ptr__,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *samples)

{
  unsigned_long uVar1;
  pointer puVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  Statistics *pSVar6;
  ulong uVar7;
  double dVar8;
  int iVar12;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  
  puVar2 = (samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)puVar2;
  lVar5 = lVar4 >> 3;
  uVar3 = (uint)lVar5;
  iVar12 = (int)(lVar4 >> 0x23);
  if ((int)uVar3 < 1) {
    auVar11._8_4_ = iVar12;
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = 0x45300000;
    dVar14 = (auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0);
    dVar8 = 0.0;
    dVar16 = 0.0 / dVar14;
  }
  else {
    dVar16 = 0.0;
    uVar7 = 0;
    do {
      uVar1 = puVar2[uVar7];
      auVar9._8_4_ = (int)(uVar1 >> 0x20);
      auVar9._0_8_ = uVar1;
      auVar9._12_4_ = 0x45300000;
      dVar16 = dVar16 + (auVar9._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
      uVar7 = uVar7 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar7);
    auVar10._8_4_ = iVar12;
    auVar10._0_8_ = lVar5;
    auVar10._12_4_ = 0x45300000;
    dVar14 = (auVar10._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0);
    dVar16 = dVar16 / dVar14;
    if ((int)uVar3 < 1) {
      dVar8 = 0.0;
    }
    else {
      dVar8 = 0.0;
      uVar7 = 0;
      do {
        dVar15 = (((double)CONCAT44(0x45300000,(int)(puVar2[uVar7] >> 0x20)) -
                  1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)puVar2[uVar7]) - 4503599627370496.0)) - dVar16;
        dVar8 = dVar8 + dVar15 * dVar15;
        uVar7 = uVar7 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar7);
    }
  }
  dVar8 = dVar8 / dVar14;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  lVar4 = (long)(samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(samples->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
  pSVar6 = (Statistics *)(lVar4 >> 3);
  auVar13._8_4_ = (int)(lVar4 >> 0x23);
  auVar13._0_8_ = pSVar6;
  auVar13._12_4_ = 0x45300000;
  __return_storage_ptr__->mean = dVar16;
  __return_storage_ptr__->standardDeviation = dVar8;
  __return_storage_ptr__->standardErrorOfMean =
       dVar8 / SQRT((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)pSVar6) - 4503599627370496.0));
  return pSVar6;
}

Assistant:

Statistics calculateStats (const vector<deUint64>& samples)
{
	double mean = 0.0;

	for (int i = 0; i < (int)samples.size(); i++)
		mean += (double)samples[i];

	mean /= (double)samples.size();

	double standardDeviation = 0.0;

	for (int i = 0; i < (int)samples.size(); i++)
	{
		double x = (double)samples[i];
		standardDeviation += (x - mean) * (x - mean);
	}

	standardDeviation /= (double)samples.size();
	standardDeviation = std::sqrt(standardDeviation);

	double standardErrorOfMean = standardDeviation / std::sqrt((double)samples.size());

	Statistics stats;

	stats.mean					= mean;
	stats.standardDeviation		= standardDeviation;
	stats.standardErrorOfMean	= standardErrorOfMean;

	return stats;
}